

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O0

Region * __thiscall Region::GetFirstAncestorOfNonExceptingFinallyParent(Region *this)

{
  code *pcVar1;
  bool bVar2;
  RegionType RVar3;
  Region *pRVar4;
  undefined4 *puVar5;
  Region *local_38;
  Region *local_30;
  bool local_21;
  Region *local_20;
  Region *ancestor;
  Region *this_local;
  
  local_20 = this;
  while( true ) {
    local_21 = false;
    if (local_20 != (Region *)0x0) {
      local_21 = IsNonExceptingFinally(local_20);
    }
    if (local_21 == false) break;
    local_20 = GetParent(local_20);
  }
  if ((local_20 == (Region *)0x0) || (bVar2 = IsNonExceptingFinally(local_20), bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                       ,0x52,"(ancestor && !ancestor->IsNonExceptingFinally())",
                       "ancestor && !ancestor->IsNonExceptingFinally()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((local_20 != (Region *)0x0) && (RVar3 = GetType(local_20), RVar3 != RegionTypeRoot)) {
    pRVar4 = GetParent(local_20);
    bVar2 = IsNonExceptingFinally(pRVar4);
    if (bVar2) {
      pRVar4 = GetParent(local_20);
      pRVar4 = GetFirstAncestorOfNonExceptingFinally(pRVar4);
      return pRVar4;
    }
  }
  if (local_20 == (Region *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                       ,0x59,"(ancestor)","ancestor");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (local_20 == (Region *)0x0) {
    local_38 = (Region *)0x0;
  }
  else {
    RVar3 = GetType(local_20);
    if (RVar3 == RegionTypeRoot) {
      local_30 = local_20;
    }
    else {
      local_30 = GetParent(local_20);
    }
    local_38 = local_30;
  }
  return local_38;
}

Assistant:

Region *
Region::GetFirstAncestorOfNonExceptingFinallyParent()
{
    Region * ancestor = this;
    while (ancestor && ancestor->IsNonExceptingFinally())
    {
        ancestor = ancestor->GetParent();
    }
    // ancestor is the first ancestor which is not a non exception finally
    Assert(ancestor && !ancestor->IsNonExceptingFinally());
    // If the ancestor's parent is a non exception finally, recurse
    if (ancestor && ancestor->GetType() != RegionTypeRoot && ancestor->GetParent()->IsNonExceptingFinally())
    {
        return ancestor->GetParent()->GetFirstAncestorOfNonExceptingFinally();
    }

    Assert(ancestor);
    // Null check added to avoid prefast warning only
    return ancestor ? (ancestor->GetType() == RegionTypeRoot ? ancestor : ancestor->GetParent()) : nullptr;
}